

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

void kwsysProcessCleanup(cmsysProcess *cp,int error)

{
  undefined8 __ptr;
  kwsysProcessInstances kVar1;
  __pid_t _Var2;
  int iVar3;
  int *piVar4;
  char *__src;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  int status;
  undefined1 auStack_34 [20];
  
  if (error != 0) {
    if (cp->ErrorMessage[0] == '\0') {
      piVar4 = __errno_location();
      __src = strerror(*piVar4);
      strncpy(cp->ErrorMessage,__src,0x400);
    }
    cp->State = 1;
    if (cp->ForkPIDs != (pid_t *)0x0) {
      for (lVar7 = 0; lVar7 < cp->NumberOfCommands; lVar7 = lVar7 + 1) {
        if (cp->ForkPIDs[lVar7] != 0) {
          kwsysProcessKill(cp->ForkPIDs[lVar7]);
          do {
            _Var2 = waitpid(cp->ForkPIDs[lVar7],&status,0);
            if (-1 < _Var2) break;
            piVar4 = __errno_location();
          } while (*piVar4 == 4);
        }
      }
    }
    if (cp->RealWorkingDirectory != (char *)0x0) {
      do {
        iVar3 = chdir(cp->RealWorkingDirectory);
        if (-1 < iVar3) break;
        piVar4 = __errno_location();
      } while (*piVar4 == 4);
    }
  }
  if (cp->OptionDetach != 0) {
LAB_003fa85b:
    if (cp->ForkPIDs != (pid_t *)0x0) {
      free(cp->ForkPIDs);
      cp->ForkPIDs = (pid_t *)0x0;
    }
    if (cp->RealWorkingDirectory != (char *)0x0) {
      free(cp->RealWorkingDirectory);
      cp->RealWorkingDirectory = (char *)0x0;
    }
    for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 4) {
      kwsysProcessCleanupDescriptor((int *)((long)cp->PipeReadEnds + lVar7));
    }
    for (lVar7 = 0; lVar7 != 0xc; lVar7 = lVar7 + 4) {
      kwsysProcessCleanupDescriptor((int *)((long)cp->PipeChildStd + lVar7));
    }
    return;
  }
  _status = kwsysProcesses;
  kVar1 = _status;
  status = kwsysProcesses.Count;
  auStack_34._4_8_ = kwsysProcesses.Processes;
  __ptr = auStack_34._4_8_;
  uVar5 = 0;
  uVar6 = 0;
  if (0 < status) {
    uVar6 = (ulong)(uint)status;
  }
  while( true ) {
    if (uVar6 == uVar5) goto LAB_003fa852;
    if (*(cmsysProcess **)(auStack_34._4_8_ + uVar5 * 8) == cp) break;
    uVar5 = uVar5 + 1;
  }
  status = status - 1;
  auStack_34._0_12_ = kwsysProcesses._4_12_;
  uVar6 = (ulong)(uint)status;
  if (status < (int)uVar5) {
    uVar6 = uVar5 & 0xffffffff;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    *(cmsysProcess **)(__ptr + uVar5 * 8) = *(cmsysProcess **)(__ptr + (uVar5 + 1) * 8);
  }
  if (status == 0) {
    do {
      iVar3 = sigaction(0x11,(sigaction *)&kwsysProcessesOldSigChldAction,(sigaction *)0x0);
      if (-1 < iVar3) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    do {
      iVar3 = sigaction(2,(sigaction *)&kwsysProcessesOldSigIntAction,(sigaction *)0x0);
      if (-1 < iVar3) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    do {
      iVar3 = sigaction(0xf,(sigaction *)&kwsysProcessesOldSigTermAction,(sigaction *)0x0);
      if (-1 < iVar3) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    auStack_34._0_4_ = 0;
    free((void *)__ptr);
    auStack_34._4_8_ = (cmsysProcess **)0x0;
  }
  kwsysProcessesUpdate((kwsysProcessInstances *)&status);
  kVar1 = _status;
LAB_003fa852:
  _status = kVar1;
  kwsysProcessCleanupDescriptor(&cp->SignalPipe);
  goto LAB_003fa85b;
}

Assistant:

static void kwsysProcessCleanup(kwsysProcess* cp, int error)
{
  int i;

  if (error) {
    /* We are cleaning up due to an error.  Report the error message
       if one has not been provided already.  */
    if (cp->ErrorMessage[0] == 0) {
      strncpy(cp->ErrorMessage, strerror(errno), KWSYSPE_PIPE_BUFFER_SIZE);
    }

    /* Set the error state.  */
    cp->State = kwsysProcess_State_Error;

    /* Kill any children already started.  */
    if (cp->ForkPIDs) {
      int status;
      for (i = 0; i < cp->NumberOfCommands; ++i) {
        if (cp->ForkPIDs[i]) {
          /* Kill the child.  */
          kwsysProcessKill(cp->ForkPIDs[i]);

          /* Reap the child.  Keep trying until the call is not
             interrupted.  */
          while ((waitpid(cp->ForkPIDs[i], &status, 0) < 0) &&
                 (errno == EINTR)) {
          }
        }
      }
    }

    /* Restore the working directory.  */
    if (cp->RealWorkingDirectory) {
      while ((chdir(cp->RealWorkingDirectory) < 0) && (errno == EINTR)) {
      }
    }
  }

  /* If not creating a detached child, remove this object from the
     global set of process objects that wish to be notified when a
     child exits.  */
  if (!cp->OptionDetach) {
    kwsysProcessesRemove(cp);
  }

  /* Free memory.  */
  if (cp->ForkPIDs) {
    kwsysProcessVolatileFree(cp->ForkPIDs);
    cp->ForkPIDs = 0;
  }
  if (cp->RealWorkingDirectory) {
    free(cp->RealWorkingDirectory);
    cp->RealWorkingDirectory = 0;
  }

  /* Close pipe handles.  */
  for (i = 0; i < KWSYSPE_PIPE_COUNT; ++i) {
    kwsysProcessCleanupDescriptor(&cp->PipeReadEnds[i]);
  }
  for (i = 0; i < 3; ++i) {
    kwsysProcessCleanupDescriptor(&cp->PipeChildStd[i]);
  }
}